

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInAscii * __thiscall chrono::ChStreamInAscii::operator>>(ChStreamInAscii *this,char *str)

{
  string buffer;
  char *local_38;
  undefined8 local_30;
  char local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = '\0';
  (*(this->super_ChStreamIn)._vptr_ChStreamIn[0xb])(this,&local_38);
  strcpy(str,local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

ChStreamInAscii& ChStreamInAscii::operator>>(char* str) {
    /*
    bool stop = 0;
    int cnt = 0;
    char loa[2];
    loa[1]=0;

    while(true)
    {

        try {Input(loa, 1);}
        catch (const std::exception&)
        {
            if (!(this->End_of_stream() && cnt>0))
                throw (ChException("Cannot read from stream"));
        }

        if (this->End_of_stream() || loa[0]==*"\n" || loa[0]==*" " || loa[0]==*"\t" || loa[0]==0)
            break;

        str[cnt]=loa[0];
        cnt++;
    }
    str[cnt]=NULL;
    */

    std::string buffer;
    *this >> buffer;
    strcpy(str, buffer.c_str());

    return *this;
}